

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

SSTableCache * __thiscall SSTableCache::get_abi_cxx11_(SSTableCache *this,uint64_t key)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  pointer ppVar5;
  runtime_error *this_00;
  ulong in_RDX;
  allocator local_2ca;
  undefined1 local_2c9;
  char *local_2c8;
  char *buf;
  __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  _Stack_2b8;
  int valueSize;
  int local_2b0;
  undefined1 local_2a9;
  int offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  char local_268 [8];
  ifstream in;
  allocator local_5a [2];
  __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  local_58;
  pair<unsigned_long,_int> *local_50;
  pair<unsigned_long,_int> *local_48;
  __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  local_40;
  __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  low;
  anon_class_1_0_00000001_for__M_comp cmp;
  allocator local_21;
  unsigned_long local_20;
  uint64_t key_local;
  SSTableCache *this_local;
  string *value;
  
  key_local = key;
  this_local = this;
  if ((in_RDX < *(ulong *)(key + 0x10)) || (*(ulong *)(key + 0x18) < in_RDX)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    local_20 = in_RDX;
    bVar2 = BloomFilter::exists((BloomFilter *)(key + 0x38),in_RDX);
    if (bVar2) {
      local_48 = (pair<unsigned_long,_int> *)
                 std::
                 vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                 ::begin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                          *)(key + 0x20));
      local_58._M_current =
           (pair<unsigned_long,_int> *)
           std::
           vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
           end((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                *)(key + 0x20));
      local_50 = (pair<unsigned_long,_int> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                 ::operator-(&local_58,1);
      local_40 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,int>const*,std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>>,unsigned_long,SSTableCache::get[abi:cxx11](unsigned_long)const::__0>
                           (local_48,local_50,&local_20);
      ppVar5 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
               ::operator->(&local_40);
      if (ppVar5->first == local_20) {
        _Var4 = std::operator|(_S_in,_S_bin);
        std::ifstream::ifstream(local_268,(string *)(key + 0x2838),_Var4);
        bVar3 = std::ios::fail();
        if ((bVar3 & 1) != 0) {
          local_2a9 = 1;
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)&offset,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "readDic: Open file ");
          std::operator+(local_288,(char *)&offset);
          std::runtime_error::runtime_error(this_00,(string *)local_288);
          local_2a9 = 0;
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                 ::operator->(&local_40);
        local_2b0 = ppVar5->second;
        _Stack_2b8 = __gnu_cxx::
                     __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                     ::operator++(&local_40,0);
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                 ::operator->(&local_40);
        buf._4_4_ = ppVar5->second - local_2b0;
        std::istream::seekg((long)local_268,local_2b0 + 0x282c + (int)*(undefined8 *)(key + 8) * 0xc
                           );
        local_2c8 = (char *)operator_new__((long)(buf._4_4_ + 1));
        std::istream::read(local_268,(long)local_2c8);
        pcVar1 = local_2c8;
        local_2c8[buf._4_4_] = '\0';
        local_2c9 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,pcVar1,&local_2ca);
        std::allocator<char>::~allocator((allocator<char> *)&local_2ca);
        if (local_2c8 != (char *)0x0) {
          operator_delete__(local_2c8);
        }
        std::ifstream::close();
        local_2c9 = 1;
        std::ifstream::~ifstream(local_268);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"",local_5a);
        std::allocator<char>::~allocator((allocator<char> *)local_5a);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",(allocator *)((long)&low._M_current + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&low._M_current + 3));
    }
  }
  return this;
}

Assistant:

string SSTableCache::get(uint64_t key) const {
  if (!(header.minKey <= key && key <= header.maxKey)) return "";
  if (!bloomFilter.exists(key)) return "";
  auto cmp = [](SSTableIndex left, uint64_t key) { return left.first < key; };
  auto low = lower_bound(index.begin(), index.end() - 1, key, cmp);
  if (low->first != key) return "";

  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  auto offset = low->second;
  low++;
  int valueSize;
  valueSize = low->second - offset;

  in.seekg(10272 + (header.length + 1) * 12 + offset, ifstream::beg);

  char *buf = new char[valueSize + 1];
  in.read(buf, valueSize);
  buf[valueSize] = '\0';
  string value(buf);
  delete[] buf;

  in.close();
  return value;
}